

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-vec.h
# Opt level: O1

void mp::AutoExpand<std::vector<bool,std::allocator<bool>>>
               (vector<bool,_std::allocator<bool>_> *vec,size_type i,value_type_conflict1 v)

{
  _Bit_type *p_Var1;
  long lVar2;
  ulong uVar4;
  ulong uVar5;
  size_type sVar3;
  
  p_Var1 = (vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) * 8 <= i) {
    if ((ulong)(((long)(vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_end_of_storage - (long)p_Var1) * 8) <= i) {
      std::vector<bool,_std::allocator<bool>_>::reserve(vec,(i * 0xd + 0xd) / 10);
    }
    std::vector<bool,_std::allocator<bool>_>::resize(vec,i + 1,false);
  }
  sVar3 = i + 0x3f;
  if (-1 < (long)i) {
    sVar3 = i;
  }
  lVar2 = (long)sVar3 >> 6;
  p_Var1 = (vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar4 = (ulong)((i & 0x800000000000003f) < 0x8000000000000001);
  uVar5 = 1L << ((byte)i & 0x3f);
  if (v) {
    uVar5 = uVar5 | p_Var1[lVar2 + uVar4 + 0xffffffffffffffff];
  }
  else {
    uVar5 = ~uVar5 & p_Var1[lVar2 + uVar4 + 0xffffffffffffffff];
  }
  p_Var1[lVar2 + uVar4 + 0xffffffffffffffff] = uVar5;
  return;
}

Assistant:

void AutoExpand(
		Vec& vec, typename Vec::size_type i, typename Vec::value_type v) {
  if (vec.size()<=i) {
    if (vec.capacity()<=i)
      vec.reserve(((i+1)*13)/10);
    vec.resize(i+1);
  }
	vec[i] = std::move(v);
}